

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_auth.c
# Opt level: O3

ssize_t tnt_auth_raw(tnt_stream *s,char *user,int ulen,char *pass,int plen,char *base64_salt)

{
  SHA1_CTX *context;
  char *pcVar1;
  int iVar2;
  long lVar3;
  uchar *puVar4;
  ssize_t sVar5;
  char cVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  uchar local_1f8 [8];
  char salt [64];
  uchar hash2 [20];
  char len_prefix [9];
  byte local_148 [8];
  uchar hash1 [20];
  byte local_128 [8];
  char scramble [20];
  undefined1 local_108 [8];
  iovec v [6];
  char body [64];
  undefined1 uStack_58;
  undefined1 uStack_57;
  undefined2 uStack_56;
  char acStack_54 [4];
  tnt_iheader hdr;
  
  uVar8 = 5;
  if (user == (char *)0x0) {
    user = "guest";
    bVar11 = true;
  }
  else if (ulen == 5) {
    iVar2 = strncmp(user,"guest",5);
    bVar11 = iVar2 == 0;
    if (bVar11) {
      user = "guest";
    }
  }
  else {
    bVar11 = false;
    uVar8 = ulen;
  }
  uVar9 = s->reqid;
  s->reqid = uVar9 + 1;
  uStack_57 = 0;
  acStack_54[1] = '\0';
  acStack_54[2] = '\0';
  acStack_54[3] = '\0';
  hdr.header[0] = '\0';
  hdr.header[1] = '\0';
  hdr.header[2] = '\0';
  hdr.header[3] = '\0';
  hdr.header[4] = '\0';
  hdr.header[5] = '\0';
  hdr.header[6] = '\0';
  hdr.header[7] = '\0';
  hdr.header[8] = '\0';
  hdr.header[9] = '\0';
  hdr.header[10] = '\0';
  hdr.header[0xb] = '\0';
  hdr.header[0xc] = '\0';
  hdr.header[0xd] = '\0';
  hdr.header[0xe] = '\0';
  hdr.header[0xf] = '\0';
  hdr.header[0x10] = '\0';
  hdr.header[0x11] = '\0';
  hdr.header[0x12] = '\0';
  hdr.header[0x13] = '\0';
  hdr.header[0x14] = '\0';
  hdr.header[0x15] = '\0';
  hdr.header[0x16] = '\0';
  hdr.header[0x17] = '\0';
  uStack_58 = 0x82;
  uStack_56 = 0x107;
  cVar6 = (char)uVar9;
  if (uVar9 < 0x80) {
    acStack_54[0] = cVar6;
    lVar7 = 1;
  }
  else if (uVar9 < 0x100) {
    acStack_54[0] = -0x34;
    acStack_54[1] = cVar6;
    lVar7 = 2;
  }
  else {
    acStack_54[1] = (char)(uVar9 >> 8);
    if (uVar9 < 0x10000) {
      acStack_54[0] = -0x33;
      lVar7 = 3;
      acStack_54[2] = cVar6;
    }
    else if (uVar9 >> 0x20 == 0) {
      acStack_54[0] = -0x32;
      acStack_54[2] = (char)(uVar9 >> 0x10);
      acStack_54[3] = acStack_54[1];
      acStack_54[1] = (char)(uVar9 >> 0x18);
      lVar7 = 5;
      hdr.header[0] = cVar6;
    }
    else {
      acStack_54[0] = -0x31;
      acStack_54[2] = (char)(uVar9 >> 0x30);
      acStack_54[3] = (char)(uVar9 >> 0x28);
      hdr.header[0] = (char)(uVar9 >> 0x20);
      hdr.header._1_4_ =
           (uint)(uVar9 >> 0x18) & 0xff | (uint)(uVar9 >> 8) & 0xff00 |
           (uint)(((uVar9 & 0xff00) << 0x28) >> 0x20) | (uint)((uVar9 << 0x38) >> 0x20);
      acStack_54[1] = (char)(uVar9 >> 0x38);
      lVar7 = 9;
    }
  }
  v[0].iov_len = (size_t)&uStack_58;
  hdr._24_8_ = acStack_54 + lVar7;
  v[1].iov_base = acStack_54 + lVar7 + -v[0].iov_len;
  v[5].iov_len._0_2_ = 0x2382;
  if (uVar8 < 0x20) {
    v[5].iov_len._2_1_ = (byte)uVar8 | 0xa0;
    lVar7 = 1;
  }
  else if (uVar8 < 0x100) {
    v[5].iov_len._2_1_ = 0xd9;
    v[5].iov_len._3_1_ = (byte)uVar8;
    lVar7 = 2;
  }
  else if (uVar8 < 0x10000) {
    v[5].iov_len._2_1_ = 0xda;
    v[5].iov_len._3_2_ = (ushort)uVar8 << 8 | (ushort)uVar8 >> 8;
    lVar7 = 3;
  }
  else {
    v[5].iov_len._2_1_ = 0xdb;
    v[5].iov_len._3_4_ =
         uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    lVar7 = 5;
  }
  v[3].iov_len = (long)&v[5].iov_len + lVar7 + 2;
  v[1].iov_len = (size_t)&v[5].iov_len;
  v[2].iov_base = (void *)(v[3].iov_len - (long)&v[5].iov_len);
  v[2].iov_len = (size_t)user;
  v[3].iov_base = (void *)(long)(int)uVar8;
  *(undefined1 *)((long)&v[5].iov_len + lVar7 + 2) = 0x21;
  if (bVar11) {
    pcVar1 = (char *)((long)&v[5].iov_len + 4);
    *(undefined1 *)((long)&v[5].iov_len + lVar7 + 3) = 0x90;
    iVar2 = 5;
  }
  else {
    *(undefined2 *)((long)&v[5].iov_len + lVar7 + 3) = 0xa992;
    *(undefined8 *)((long)&v[5].iov_len + lVar7 + 5) = 0x6168732d70616863;
    (body + lVar7 + 5)[0] = '1';
    (body + lVar7 + 5)[1] = -0x4c;
    base64_decode(base64_salt,0x2c,(char *)local_1f8,0x40);
    context = (SHA1_CTX *)(hash2 + 0xc);
    SHA1Init(context);
    SHA1Update(context,(uchar *)pass,plen);
    SHA1Final(local_148,context);
    SHA1Init(context);
    SHA1Update(context,local_148,0x14);
    SHA1Final((uchar *)(salt + 0x38),context);
    SHA1Init(context);
    SHA1Update(context,local_1f8,0x14);
    SHA1Update(context,(uchar *)(salt + 0x38),0x14);
    SHA1Final(local_128,context);
    lVar3 = 0;
    do {
      local_128[lVar3] = local_128[lVar3] ^ local_148[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x14);
    pcVar1 = body + 7;
    v[4].iov_len = (size_t)local_128;
    v[5].iov_base = (void *)0x14;
    iVar2 = 6;
  }
  puVar4 = (uchar *)(len_prefix + 1);
  v[4].iov_base = pcVar1 + (lVar7 - v[3].iov_len);
  uVar10 = 0x10;
  uVar9 = 0;
  do {
    uVar9 = uVar9 + *(long *)((long)&v[0].iov_base + uVar10);
    uVar10 = uVar10 + 0x10;
  } while ((uint)(iVar2 << 4) != uVar10);
  if (uVar9 >> 0x20 == 0) {
    uVar8 = (uint)uVar9;
    stack0xfffffffffffffe5d =
         CONCAT44(stack0xfffffffffffffe61,
                  uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
    hash2[0xc] = 0xce;
    puVar4 = hash2 + 0x11;
  }
  else {
    register0x00000030 =
         uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
         (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
         (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
    hash2[0xc] = 0xcf;
  }
  local_108 = (undefined1  [8])(hash2 + 0xc);
  v[0].iov_base = puVar4 + -(long)local_108;
  sVar5 = (*s->writev)(s,(iovec *)local_108,iVar2);
  return sVar5;
}

Assistant:

ssize_t
tnt_auth_raw(struct tnt_stream *s, const char *user, int ulen,
	     const char *pass, int plen, const char *base64_salt)
{
	struct tnt_iheader hdr;
	struct iovec v[6]; int v_sz = 5;
	char *data = NULL, *body_start = NULL;
	int guest = !user || (ulen == 5 && !strncmp(user, "guest", 5));
	if (guest) {
		user = "guest";
		ulen = 5;
	}
	encode_header(&hdr, TNT_OP_AUTH, s->reqid++);
	v[1].iov_base = (void *)hdr.header;
	v[1].iov_len  = hdr.end - hdr.header;
	char body[64]; data = body; body_start = data;

	data = mp_encode_map(data, 2);
	data = mp_encode_uint(data, TNT_USERNAME);
	data = mp_encode_strl(data, ulen);
	v[2].iov_base = body_start;
	v[2].iov_len  = data - body_start;
	v[3].iov_base = (void *)user;
	v[3].iov_len  = ulen;
	body_start = data;
	data = mp_encode_uint(data, TNT_TUPLE);
	char salt[64], scramble[TNT_SCRAMBLE_SIZE];
	if (!guest) {
		data = mp_encode_array(data, 2);
		data = mp_encode_str(data, "chap-sha1", strlen("chap-sha1"));
		data = mp_encode_strl(data, TNT_SCRAMBLE_SIZE);
		base64_decode(base64_salt, TNT_SALT_SIZE, salt, 64);
		tnt_scramble_prepare(scramble, salt, pass, plen);
		v[5].iov_base = scramble;
		v[5].iov_len  = TNT_SCRAMBLE_SIZE;
		v_sz++;
	} else {
		data = mp_encode_array(data, 0);
	}
	v[4].iov_base = body_start;
	v[4].iov_len  = data - body_start;

	size_t package_len = 0;
	for (int i = 1; i < v_sz; ++i) {
		package_len += v[i].iov_len;
	}
	char len_prefix[9];
	char *len_end = mp_encode_luint32(len_prefix, package_len);
	v[0].iov_base = len_prefix;
	v[0].iov_len = len_end - len_prefix;
	return s->writev(s, v, v_sz);
}